

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parsers.h
# Opt level: O1

Result<wasm::Ok> *
wasm::WATParser::makeResume<wasm::WATParser::ParseDefsCtx>
          (Result<wasm::Ok> *__return_storage_ptr__,ParseDefsCtx *ctx,Index pos,
          vector<wasm::WATParser::Annotation,_std::allocator<wasm::WATParser::Annotation>_>
          *annotations)

{
  undefined1 *puVar1;
  undefined8 *puVar2;
  _Copy_ctor_base<false,_std::vector<wasm::WATParser::ParseDefsCtx::OnClauseInfo,_std::allocator<wasm::WATParser::ParseDefsCtx::OnClauseInfo>_>,_wasm::Err>
  *resumetable_00;
  undefined1 local_c8 [8];
  Result<wasm::WATParser::TypeParserCtx<wasm::WATParser::ParseDefsCtx>::HeapTypeT> type;
  undefined8 local_98;
  undefined1 local_90;
  undefined7 uStack_8f;
  undefined8 uStack_88;
  undefined1 local_80 [8];
  Result<std::vector<wasm::WATParser::ParseDefsCtx::OnClauseInfo,_std::allocator<wasm::WATParser::ParseDefsCtx::OnClauseInfo>_>_>
  resumetable;
  Result<std::vector<wasm::WATParser::ParseDefsCtx::OnClauseInfo,_std::allocator<wasm::WATParser::ParseDefsCtx::OnClauseInfo>_>_>
  _val_1;
  
  typeidx<wasm::WATParser::ParseDefsCtx>
            ((Result<wasm::WATParser::TypeParserCtx<wasm::WATParser::ParseDefsCtx>::HeapTypeT> *)
             local_c8,ctx);
  std::__detail::__variant::
  _Copy_ctor_base<false,_wasm::WATParser::TypeParserCtx<wasm::WATParser::ParseDefsCtx>::HeapTypeT,_wasm::Err>
  ::_Copy_ctor_base((_Copy_ctor_base<false,_wasm::WATParser::TypeParserCtx<wasm::WATParser::ParseDefsCtx>::HeapTypeT,_wasm::Err>
                     *)local_80,
                    (_Copy_ctor_base<false,_wasm::WATParser::TypeParserCtx<wasm::WATParser::ParseDefsCtx>::HeapTypeT,_wasm::Err>
                     *)local_c8);
  if (resumetable.val.
      super__Variant_base<std::vector<wasm::WATParser::ParseDefsCtx::OnClauseInfo,_std::allocator<wasm::WATParser::ParseDefsCtx::OnClauseInfo>_>,_wasm::Err>
      .super__Move_assign_alias<std::vector<wasm::WATParser::ParseDefsCtx::OnClauseInfo>,_wasm::Err>
      .super__Copy_assign_alias<std::vector<wasm::WATParser::ParseDefsCtx::OnClauseInfo>,_wasm::Err>
      .super__Move_ctor_alias<std::vector<wasm::WATParser::ParseDefsCtx::OnClauseInfo>,_wasm::Err>.
      super__Copy_ctor_alias<std::vector<wasm::WATParser::ParseDefsCtx::OnClauseInfo>,_wasm::Err>.
      super__Variant_storage_alias<std::vector<wasm::WATParser::ParseDefsCtx::OnClauseInfo>,_wasm::Err>
      ._M_u._24_1_ == '\x01') {
    puVar1 = (undefined1 *)
             ((long)&_val_1.val.
                     super__Variant_base<std::vector<wasm::WATParser::ParseDefsCtx::OnClauseInfo,_std::allocator<wasm::WATParser::ParseDefsCtx::OnClauseInfo>_>,_wasm::Err>
                     .
                     super__Move_assign_alias<std::vector<wasm::WATParser::ParseDefsCtx::OnClauseInfo>,_wasm::Err>
                     .
                     super__Copy_assign_alias<std::vector<wasm::WATParser::ParseDefsCtx::OnClauseInfo>,_wasm::Err>
                     .
                     super__Move_ctor_alias<std::vector<wasm::WATParser::ParseDefsCtx::OnClauseInfo>,_wasm::Err>
                     .
                     super__Copy_ctor_alias<std::vector<wasm::WATParser::ParseDefsCtx::OnClauseInfo>,_wasm::Err>
             + 8);
    resumetable.val.
    super__Variant_base<std::vector<wasm::WATParser::ParseDefsCtx::OnClauseInfo,_std::allocator<wasm::WATParser::ParseDefsCtx::OnClauseInfo>_>,_wasm::Err>
    .super__Move_assign_alias<std::vector<wasm::WATParser::ParseDefsCtx::OnClauseInfo>,_wasm::Err>.
    super__Copy_assign_alias<std::vector<wasm::WATParser::ParseDefsCtx::OnClauseInfo>,_wasm::Err>.
    super__Move_ctor_alias<std::vector<wasm::WATParser::ParseDefsCtx::OnClauseInfo>,_wasm::Err>.
    super__Copy_ctor_alias<std::vector<wasm::WATParser::ParseDefsCtx::OnClauseInfo>,_wasm::Err>.
    super__Variant_storage_alias<std::vector<wasm::WATParser::ParseDefsCtx::OnClauseInfo>,_wasm::Err>
    ._32_8_ = puVar1;
    std::__cxx11::string::_M_construct<char*>
              ((string *)
               ((long)&resumetable.val.
                       super__Variant_base<std::vector<wasm::WATParser::ParseDefsCtx::OnClauseInfo,_std::allocator<wasm::WATParser::ParseDefsCtx::OnClauseInfo>_>,_wasm::Err>
                       .
                       super__Move_assign_alias<std::vector<wasm::WATParser::ParseDefsCtx::OnClauseInfo>,_wasm::Err>
                       .
                       super__Copy_assign_alias<std::vector<wasm::WATParser::ParseDefsCtx::OnClauseInfo>,_wasm::Err>
                       .
                       super__Move_ctor_alias<std::vector<wasm::WATParser::ParseDefsCtx::OnClauseInfo>,_wasm::Err>
                       .
                       super__Copy_ctor_alias<std::vector<wasm::WATParser::ParseDefsCtx::OnClauseInfo>,_wasm::Err>
               + 0x20),local_80,
               resumetable.val.
               super__Variant_base<std::vector<wasm::WATParser::ParseDefsCtx::OnClauseInfo,_std::allocator<wasm::WATParser::ParseDefsCtx::OnClauseInfo>_>,_wasm::Err>
               .
               super__Move_assign_alias<std::vector<wasm::WATParser::ParseDefsCtx::OnClauseInfo>,_wasm::Err>
               .
               super__Copy_assign_alias<std::vector<wasm::WATParser::ParseDefsCtx::OnClauseInfo>,_wasm::Err>
               .
               super__Move_ctor_alias<std::vector<wasm::WATParser::ParseDefsCtx::OnClauseInfo>,_wasm::Err>
               .
               super__Copy_ctor_alias<std::vector<wasm::WATParser::ParseDefsCtx::OnClauseInfo>,_wasm::Err>
               .
               super__Variant_storage_alias<std::vector<wasm::WATParser::ParseDefsCtx::OnClauseInfo>,_wasm::Err>
               ._M_u._0_8_ + (long)local_80);
    puVar2 = (undefined8 *)
             ((long)&(__return_storage_ptr__->val).super__Variant_base<wasm::Ok,_wasm::Err>.
                     super__Move_assign_alias<wasm::Ok,_wasm::Err>.
                     super__Copy_assign_alias<wasm::Ok,_wasm::Err>.
                     super__Move_ctor_alias<wasm::Ok,_wasm::Err>.
                     super__Copy_ctor_alias<wasm::Ok,_wasm::Err>.
                     super__Variant_storage_alias<wasm::Ok,_wasm::Err> + 0x10);
    *(undefined8 **)
     &(__return_storage_ptr__->val).super__Variant_base<wasm::Ok,_wasm::Err>.
      super__Move_assign_alias<wasm::Ok,_wasm::Err>.super__Copy_assign_alias<wasm::Ok,_wasm::Err>.
      super__Move_ctor_alias<wasm::Ok,_wasm::Err>.super__Copy_ctor_alias<wasm::Ok,_wasm::Err>.
      super__Variant_storage_alias<wasm::Ok,_wasm::Err> = puVar2;
    if ((undefined1 *)
        resumetable.val.
        super__Variant_base<std::vector<wasm::WATParser::ParseDefsCtx::OnClauseInfo,_std::allocator<wasm::WATParser::ParseDefsCtx::OnClauseInfo>_>,_wasm::Err>
        .
        super__Move_assign_alias<std::vector<wasm::WATParser::ParseDefsCtx::OnClauseInfo>,_wasm::Err>
        .
        super__Copy_assign_alias<std::vector<wasm::WATParser::ParseDefsCtx::OnClauseInfo>,_wasm::Err>
        .super__Move_ctor_alias<std::vector<wasm::WATParser::ParseDefsCtx::OnClauseInfo>,_wasm::Err>
        .super__Copy_ctor_alias<std::vector<wasm::WATParser::ParseDefsCtx::OnClauseInfo>,_wasm::Err>
        .
        super__Variant_storage_alias<std::vector<wasm::WATParser::ParseDefsCtx::OnClauseInfo>,_wasm::Err>
        ._32_8_ == puVar1) {
      *puVar2 = CONCAT71(_val_1.val.
                         super__Variant_base<std::vector<wasm::WATParser::ParseDefsCtx::OnClauseInfo,_std::allocator<wasm::WATParser::ParseDefsCtx::OnClauseInfo>_>,_wasm::Err>
                         .
                         super__Move_assign_alias<std::vector<wasm::WATParser::ParseDefsCtx::OnClauseInfo>,_wasm::Err>
                         .
                         super__Copy_assign_alias<std::vector<wasm::WATParser::ParseDefsCtx::OnClauseInfo>,_wasm::Err>
                         .
                         super__Move_ctor_alias<std::vector<wasm::WATParser::ParseDefsCtx::OnClauseInfo>,_wasm::Err>
                         .
                         super__Copy_ctor_alias<std::vector<wasm::WATParser::ParseDefsCtx::OnClauseInfo>,_wasm::Err>
                         .
                         super__Variant_storage_alias<std::vector<wasm::WATParser::ParseDefsCtx::OnClauseInfo>,_wasm::Err>
                         ._M_u._9_7_,
                         _val_1.val.
                         super__Variant_base<std::vector<wasm::WATParser::ParseDefsCtx::OnClauseInfo,_std::allocator<wasm::WATParser::ParseDefsCtx::OnClauseInfo>_>,_wasm::Err>
                         .
                         super__Move_assign_alias<std::vector<wasm::WATParser::ParseDefsCtx::OnClauseInfo>,_wasm::Err>
                         .
                         super__Copy_assign_alias<std::vector<wasm::WATParser::ParseDefsCtx::OnClauseInfo>,_wasm::Err>
                         .
                         super__Move_ctor_alias<std::vector<wasm::WATParser::ParseDefsCtx::OnClauseInfo>,_wasm::Err>
                         .
                         super__Copy_ctor_alias<std::vector<wasm::WATParser::ParseDefsCtx::OnClauseInfo>,_wasm::Err>
                         .
                         super__Variant_storage_alias<std::vector<wasm::WATParser::ParseDefsCtx::OnClauseInfo>,_wasm::Err>
                         ._M_u._M_first._M_storage._M_storage[8]);
      *(undefined8 *)
       ((long)&(__return_storage_ptr__->val).super__Variant_base<wasm::Ok,_wasm::Err>.
               super__Move_assign_alias<wasm::Ok,_wasm::Err>.
               super__Copy_assign_alias<wasm::Ok,_wasm::Err>.
               super__Move_ctor_alias<wasm::Ok,_wasm::Err>.
               super__Copy_ctor_alias<wasm::Ok,_wasm::Err>.
               super__Variant_storage_alias<wasm::Ok,_wasm::Err> + 0x18) =
           _val_1.val.
           super__Variant_base<std::vector<wasm::WATParser::ParseDefsCtx::OnClauseInfo,_std::allocator<wasm::WATParser::ParseDefsCtx::OnClauseInfo>_>,_wasm::Err>
           .
           super__Move_assign_alias<std::vector<wasm::WATParser::ParseDefsCtx::OnClauseInfo>,_wasm::Err>
           .
           super__Copy_assign_alias<std::vector<wasm::WATParser::ParseDefsCtx::OnClauseInfo>,_wasm::Err>
           .
           super__Move_ctor_alias<std::vector<wasm::WATParser::ParseDefsCtx::OnClauseInfo>,_wasm::Err>
           .
           super__Copy_ctor_alias<std::vector<wasm::WATParser::ParseDefsCtx::OnClauseInfo>,_wasm::Err>
           .
           super__Variant_storage_alias<std::vector<wasm::WATParser::ParseDefsCtx::OnClauseInfo>,_wasm::Err>
           ._M_u._16_8_;
    }
    else {
      *(undefined8 *)
       &(__return_storage_ptr__->val).super__Variant_base<wasm::Ok,_wasm::Err>.
        super__Move_assign_alias<wasm::Ok,_wasm::Err>.super__Copy_assign_alias<wasm::Ok,_wasm::Err>.
        super__Move_ctor_alias<wasm::Ok,_wasm::Err>.super__Copy_ctor_alias<wasm::Ok,_wasm::Err>.
        super__Variant_storage_alias<wasm::Ok,_wasm::Err> =
           resumetable.val.
           super__Variant_base<std::vector<wasm::WATParser::ParseDefsCtx::OnClauseInfo,_std::allocator<wasm::WATParser::ParseDefsCtx::OnClauseInfo>_>,_wasm::Err>
           .
           super__Move_assign_alias<std::vector<wasm::WATParser::ParseDefsCtx::OnClauseInfo>,_wasm::Err>
           .
           super__Copy_assign_alias<std::vector<wasm::WATParser::ParseDefsCtx::OnClauseInfo>,_wasm::Err>
           .
           super__Move_ctor_alias<std::vector<wasm::WATParser::ParseDefsCtx::OnClauseInfo>,_wasm::Err>
           .
           super__Copy_ctor_alias<std::vector<wasm::WATParser::ParseDefsCtx::OnClauseInfo>,_wasm::Err>
           .
           super__Variant_storage_alias<std::vector<wasm::WATParser::ParseDefsCtx::OnClauseInfo>,_wasm::Err>
           ._32_8_;
      *(ulong *)((long)&(__return_storage_ptr__->val).super__Variant_base<wasm::Ok,_wasm::Err>.
                        super__Move_assign_alias<wasm::Ok,_wasm::Err>.
                        super__Copy_assign_alias<wasm::Ok,_wasm::Err>.
                        super__Move_ctor_alias<wasm::Ok,_wasm::Err>.
                        super__Copy_ctor_alias<wasm::Ok,_wasm::Err>.
                        super__Variant_storage_alias<wasm::Ok,_wasm::Err> + 0x10) =
           CONCAT71(_val_1.val.
                    super__Variant_base<std::vector<wasm::WATParser::ParseDefsCtx::OnClauseInfo,_std::allocator<wasm::WATParser::ParseDefsCtx::OnClauseInfo>_>,_wasm::Err>
                    .
                    super__Move_assign_alias<std::vector<wasm::WATParser::ParseDefsCtx::OnClauseInfo>,_wasm::Err>
                    .
                    super__Copy_assign_alias<std::vector<wasm::WATParser::ParseDefsCtx::OnClauseInfo>,_wasm::Err>
                    .
                    super__Move_ctor_alias<std::vector<wasm::WATParser::ParseDefsCtx::OnClauseInfo>,_wasm::Err>
                    .
                    super__Copy_ctor_alias<std::vector<wasm::WATParser::ParseDefsCtx::OnClauseInfo>,_wasm::Err>
                    .
                    super__Variant_storage_alias<std::vector<wasm::WATParser::ParseDefsCtx::OnClauseInfo>,_wasm::Err>
                    ._M_u._9_7_,
                    _val_1.val.
                    super__Variant_base<std::vector<wasm::WATParser::ParseDefsCtx::OnClauseInfo,_std::allocator<wasm::WATParser::ParseDefsCtx::OnClauseInfo>_>,_wasm::Err>
                    .
                    super__Move_assign_alias<std::vector<wasm::WATParser::ParseDefsCtx::OnClauseInfo>,_wasm::Err>
                    .
                    super__Copy_assign_alias<std::vector<wasm::WATParser::ParseDefsCtx::OnClauseInfo>,_wasm::Err>
                    .
                    super__Move_ctor_alias<std::vector<wasm::WATParser::ParseDefsCtx::OnClauseInfo>,_wasm::Err>
                    .
                    super__Copy_ctor_alias<std::vector<wasm::WATParser::ParseDefsCtx::OnClauseInfo>,_wasm::Err>
                    .
                    super__Variant_storage_alias<std::vector<wasm::WATParser::ParseDefsCtx::OnClauseInfo>,_wasm::Err>
                    ._M_u._M_first._M_storage._M_storage[8]);
    }
    *(undefined8 *)
     ((long)&(__return_storage_ptr__->val).super__Variant_base<wasm::Ok,_wasm::Err>.
             super__Move_assign_alias<wasm::Ok,_wasm::Err>.
             super__Copy_assign_alias<wasm::Ok,_wasm::Err>.
             super__Move_ctor_alias<wasm::Ok,_wasm::Err>.super__Copy_ctor_alias<wasm::Ok,_wasm::Err>
             .super__Variant_storage_alias<wasm::Ok,_wasm::Err> + 8) =
         _val_1.val.
         super__Variant_base<std::vector<wasm::WATParser::ParseDefsCtx::OnClauseInfo,_std::allocator<wasm::WATParser::ParseDefsCtx::OnClauseInfo>_>,_wasm::Err>
         .
         super__Move_assign_alias<std::vector<wasm::WATParser::ParseDefsCtx::OnClauseInfo>,_wasm::Err>
         .
         super__Copy_assign_alias<std::vector<wasm::WATParser::ParseDefsCtx::OnClauseInfo>,_wasm::Err>
         .
         super__Move_ctor_alias<std::vector<wasm::WATParser::ParseDefsCtx::OnClauseInfo>,_wasm::Err>
         .
         super__Copy_ctor_alias<std::vector<wasm::WATParser::ParseDefsCtx::OnClauseInfo>,_wasm::Err>
         .
         super__Variant_storage_alias<std::vector<wasm::WATParser::ParseDefsCtx::OnClauseInfo>,_wasm::Err>
         ._M_u._0_8_;
    _val_1.val.
    super__Variant_base<std::vector<wasm::WATParser::ParseDefsCtx::OnClauseInfo,_std::allocator<wasm::WATParser::ParseDefsCtx::OnClauseInfo>_>,_wasm::Err>
    .super__Move_assign_alias<std::vector<wasm::WATParser::ParseDefsCtx::OnClauseInfo>,_wasm::Err>.
    super__Copy_assign_alias<std::vector<wasm::WATParser::ParseDefsCtx::OnClauseInfo>,_wasm::Err>.
    super__Move_ctor_alias<std::vector<wasm::WATParser::ParseDefsCtx::OnClauseInfo>,_wasm::Err>.
    super__Copy_ctor_alias<std::vector<wasm::WATParser::ParseDefsCtx::OnClauseInfo>,_wasm::Err>.
    super__Variant_storage_alias<std::vector<wasm::WATParser::ParseDefsCtx::OnClauseInfo>,_wasm::Err>
    ._M_u._0_8_ = 0;
    _val_1.val.
    super__Variant_base<std::vector<wasm::WATParser::ParseDefsCtx::OnClauseInfo,_std::allocator<wasm::WATParser::ParseDefsCtx::OnClauseInfo>_>,_wasm::Err>
    .super__Move_assign_alias<std::vector<wasm::WATParser::ParseDefsCtx::OnClauseInfo>,_wasm::Err>.
    super__Copy_assign_alias<std::vector<wasm::WATParser::ParseDefsCtx::OnClauseInfo>,_wasm::Err>.
    super__Move_ctor_alias<std::vector<wasm::WATParser::ParseDefsCtx::OnClauseInfo>,_wasm::Err>.
    super__Copy_ctor_alias<std::vector<wasm::WATParser::ParseDefsCtx::OnClauseInfo>,_wasm::Err>.
    super__Variant_storage_alias<std::vector<wasm::WATParser::ParseDefsCtx::OnClauseInfo>,_wasm::Err>
    ._M_u._M_first._M_storage._M_storage[8] = '\0';
    *(__index_type *)
     ((long)&(__return_storage_ptr__->val).super__Variant_base<wasm::Ok,_wasm::Err>.
             super__Move_assign_alias<wasm::Ok,_wasm::Err>.
             super__Copy_assign_alias<wasm::Ok,_wasm::Err>.
             super__Move_ctor_alias<wasm::Ok,_wasm::Err>.super__Copy_ctor_alias<wasm::Ok,_wasm::Err>
             .super__Variant_storage_alias<wasm::Ok,_wasm::Err> + 0x20) = '\x01';
    resumetable.val.
    super__Variant_base<std::vector<wasm::WATParser::ParseDefsCtx::OnClauseInfo,_std::allocator<wasm::WATParser::ParseDefsCtx::OnClauseInfo>_>,_wasm::Err>
    .super__Move_assign_alias<std::vector<wasm::WATParser::ParseDefsCtx::OnClauseInfo>,_wasm::Err>.
    super__Copy_assign_alias<std::vector<wasm::WATParser::ParseDefsCtx::OnClauseInfo>,_wasm::Err>.
    super__Move_ctor_alias<std::vector<wasm::WATParser::ParseDefsCtx::OnClauseInfo>,_wasm::Err>.
    super__Copy_ctor_alias<std::vector<wasm::WATParser::ParseDefsCtx::OnClauseInfo>,_wasm::Err>.
    super__Variant_storage_alias<std::vector<wasm::WATParser::ParseDefsCtx::OnClauseInfo>,_wasm::Err>
    ._32_8_ = puVar1;
    std::__detail::__variant::
    _Variant_storage<false,_wasm::WATParser::TypeParserCtx<wasm::WATParser::ParseDefsCtx>::HeapTypeT,_wasm::Err>
    ::~_Variant_storage((_Variant_storage<false,_wasm::WATParser::TypeParserCtx<wasm::WATParser::ParseDefsCtx>::HeapTypeT,_wasm::Err>
                         *)local_80);
  }
  else {
    std::__detail::__variant::
    _Variant_storage<false,_wasm::WATParser::TypeParserCtx<wasm::WATParser::ParseDefsCtx>::HeapTypeT,_wasm::Err>
    ::~_Variant_storage((_Variant_storage<false,_wasm::WATParser::TypeParserCtx<wasm::WATParser::ParseDefsCtx>::HeapTypeT,_wasm::Err>
                         *)local_80);
    makeResumeTable<wasm::WATParser::ParseDefsCtx>
              ((Result<std::vector<wasm::WATParser::ParseDefsCtx::OnClauseInfo,_std::allocator<wasm::WATParser::ParseDefsCtx::OnClauseInfo>_>_>
                *)local_80,ctx);
    std::__detail::__variant::
    _Copy_ctor_base<false,_std::vector<wasm::WATParser::ParseDefsCtx::OnClauseInfo,_std::allocator<wasm::WATParser::ParseDefsCtx::OnClauseInfo>_>,_wasm::Err>
    ::_Copy_ctor_base((_Copy_ctor_base<false,_std::vector<wasm::WATParser::ParseDefsCtx::OnClauseInfo,_std::allocator<wasm::WATParser::ParseDefsCtx::OnClauseInfo>_>,_wasm::Err>
                       *)((long)&resumetable.val.
                                 super__Variant_base<std::vector<wasm::WATParser::ParseDefsCtx::OnClauseInfo,_std::allocator<wasm::WATParser::ParseDefsCtx::OnClauseInfo>_>,_wasm::Err>
                                 .
                                 super__Move_assign_alias<std::vector<wasm::WATParser::ParseDefsCtx::OnClauseInfo>,_wasm::Err>
                                 .
                                 super__Copy_assign_alias<std::vector<wasm::WATParser::ParseDefsCtx::OnClauseInfo>,_wasm::Err>
                                 .
                                 super__Move_ctor_alias<std::vector<wasm::WATParser::ParseDefsCtx::OnClauseInfo>,_wasm::Err>
                                 .
                                 super__Copy_ctor_alias<std::vector<wasm::WATParser::ParseDefsCtx::OnClauseInfo>,_wasm::Err>
                         + 0x20),
                      (_Copy_ctor_base<false,_std::vector<wasm::WATParser::ParseDefsCtx::OnClauseInfo,_std::allocator<wasm::WATParser::ParseDefsCtx::OnClauseInfo>_>,_wasm::Err>
                       *)local_80);
    if (_val_1.val.
        super__Variant_base<std::vector<wasm::WATParser::ParseDefsCtx::OnClauseInfo,_std::allocator<wasm::WATParser::ParseDefsCtx::OnClauseInfo>_>,_wasm::Err>
        .
        super__Move_assign_alias<std::vector<wasm::WATParser::ParseDefsCtx::OnClauseInfo>,_wasm::Err>
        .
        super__Copy_assign_alias<std::vector<wasm::WATParser::ParseDefsCtx::OnClauseInfo>,_wasm::Err>
        .super__Move_ctor_alias<std::vector<wasm::WATParser::ParseDefsCtx::OnClauseInfo>,_wasm::Err>
        .super__Copy_ctor_alias<std::vector<wasm::WATParser::ParseDefsCtx::OnClauseInfo>,_wasm::Err>
        .
        super__Variant_storage_alias<std::vector<wasm::WATParser::ParseDefsCtx::OnClauseInfo>,_wasm::Err>
        ._M_u._24_1_ == '\x01') {
      type.val.
      super__Variant_base<wasm::WATParser::TypeParserCtx<wasm::WATParser::ParseDefsCtx>::HeapTypeT,_wasm::Err>
      .
      super__Move_assign_alias<wasm::WATParser::TypeParserCtx<wasm::WATParser::ParseDefsCtx>::HeapTypeT,_wasm::Err>
      .
      super__Copy_assign_alias<wasm::WATParser::TypeParserCtx<wasm::WATParser::ParseDefsCtx>::HeapTypeT,_wasm::Err>
      .
      super__Move_ctor_alias<wasm::WATParser::TypeParserCtx<wasm::WATParser::ParseDefsCtx>::HeapTypeT,_wasm::Err>
      .
      super__Copy_ctor_alias<wasm::WATParser::TypeParserCtx<wasm::WATParser::ParseDefsCtx>::HeapTypeT,_wasm::Err>
      .
      super__Variant_storage_alias<wasm::WATParser::TypeParserCtx<wasm::WATParser::ParseDefsCtx>::HeapTypeT,_wasm::Err>
      ._32_8_ = &local_90;
      std::__cxx11::string::_M_construct<char*>
                ((string *)
                 ((long)&type.val.
                         super__Variant_base<wasm::WATParser::TypeParserCtx<wasm::WATParser::ParseDefsCtx>::HeapTypeT,_wasm::Err>
                         .
                         super__Move_assign_alias<wasm::WATParser::TypeParserCtx<wasm::WATParser::ParseDefsCtx>::HeapTypeT,_wasm::Err>
                         .
                         super__Copy_assign_alias<wasm::WATParser::TypeParserCtx<wasm::WATParser::ParseDefsCtx>::HeapTypeT,_wasm::Err>
                         .
                         super__Move_ctor_alias<wasm::WATParser::TypeParserCtx<wasm::WATParser::ParseDefsCtx>::HeapTypeT,_wasm::Err>
                         .
                         super__Copy_ctor_alias<wasm::WATParser::TypeParserCtx<wasm::WATParser::ParseDefsCtx>::HeapTypeT,_wasm::Err>
                 + 0x20),resumetable.val.
                         super__Variant_base<std::vector<wasm::WATParser::ParseDefsCtx::OnClauseInfo,_std::allocator<wasm::WATParser::ParseDefsCtx::OnClauseInfo>_>,_wasm::Err>
                         .
                         super__Move_assign_alias<std::vector<wasm::WATParser::ParseDefsCtx::OnClauseInfo>,_wasm::Err>
                         .
                         super__Copy_assign_alias<std::vector<wasm::WATParser::ParseDefsCtx::OnClauseInfo>,_wasm::Err>
                         .
                         super__Move_ctor_alias<std::vector<wasm::WATParser::ParseDefsCtx::OnClauseInfo>,_wasm::Err>
                         .
                         super__Copy_ctor_alias<std::vector<wasm::WATParser::ParseDefsCtx::OnClauseInfo>,_wasm::Err>
                         .
                         super__Variant_storage_alias<std::vector<wasm::WATParser::ParseDefsCtx::OnClauseInfo>,_wasm::Err>
                         ._32_8_,
                 _val_1.val.
                 super__Variant_base<std::vector<wasm::WATParser::ParseDefsCtx::OnClauseInfo,_std::allocator<wasm::WATParser::ParseDefsCtx::OnClauseInfo>_>,_wasm::Err>
                 .
                 super__Move_assign_alias<std::vector<wasm::WATParser::ParseDefsCtx::OnClauseInfo>,_wasm::Err>
                 .
                 super__Copy_assign_alias<std::vector<wasm::WATParser::ParseDefsCtx::OnClauseInfo>,_wasm::Err>
                 .
                 super__Move_ctor_alias<std::vector<wasm::WATParser::ParseDefsCtx::OnClauseInfo>,_wasm::Err>
                 .
                 super__Copy_ctor_alias<std::vector<wasm::WATParser::ParseDefsCtx::OnClauseInfo>,_wasm::Err>
                 .
                 super__Variant_storage_alias<std::vector<wasm::WATParser::ParseDefsCtx::OnClauseInfo>,_wasm::Err>
                 ._M_u._0_8_ +
                 resumetable.val.
                 super__Variant_base<std::vector<wasm::WATParser::ParseDefsCtx::OnClauseInfo,_std::allocator<wasm::WATParser::ParseDefsCtx::OnClauseInfo>_>,_wasm::Err>
                 .
                 super__Move_assign_alias<std::vector<wasm::WATParser::ParseDefsCtx::OnClauseInfo>,_wasm::Err>
                 .
                 super__Copy_assign_alias<std::vector<wasm::WATParser::ParseDefsCtx::OnClauseInfo>,_wasm::Err>
                 .
                 super__Move_ctor_alias<std::vector<wasm::WATParser::ParseDefsCtx::OnClauseInfo>,_wasm::Err>
                 .
                 super__Copy_ctor_alias<std::vector<wasm::WATParser::ParseDefsCtx::OnClauseInfo>,_wasm::Err>
                 .
                 super__Variant_storage_alias<std::vector<wasm::WATParser::ParseDefsCtx::OnClauseInfo>,_wasm::Err>
                 ._32_8_);
      puVar2 = (undefined8 *)
               ((long)&(__return_storage_ptr__->val).super__Variant_base<wasm::Ok,_wasm::Err>.
                       super__Move_assign_alias<wasm::Ok,_wasm::Err>.
                       super__Copy_assign_alias<wasm::Ok,_wasm::Err>.
                       super__Move_ctor_alias<wasm::Ok,_wasm::Err>.
                       super__Copy_ctor_alias<wasm::Ok,_wasm::Err>.
                       super__Variant_storage_alias<wasm::Ok,_wasm::Err> + 0x10);
      *(undefined8 **)
       &(__return_storage_ptr__->val).super__Variant_base<wasm::Ok,_wasm::Err>.
        super__Move_assign_alias<wasm::Ok,_wasm::Err>.super__Copy_assign_alias<wasm::Ok,_wasm::Err>.
        super__Move_ctor_alias<wasm::Ok,_wasm::Err>.super__Copy_ctor_alias<wasm::Ok,_wasm::Err>.
        super__Variant_storage_alias<wasm::Ok,_wasm::Err> = puVar2;
      if ((undefined1 *)
          type.val.
          super__Variant_base<wasm::WATParser::TypeParserCtx<wasm::WATParser::ParseDefsCtx>::HeapTypeT,_wasm::Err>
          .
          super__Move_assign_alias<wasm::WATParser::TypeParserCtx<wasm::WATParser::ParseDefsCtx>::HeapTypeT,_wasm::Err>
          .
          super__Copy_assign_alias<wasm::WATParser::TypeParserCtx<wasm::WATParser::ParseDefsCtx>::HeapTypeT,_wasm::Err>
          .
          super__Move_ctor_alias<wasm::WATParser::TypeParserCtx<wasm::WATParser::ParseDefsCtx>::HeapTypeT,_wasm::Err>
          .
          super__Copy_ctor_alias<wasm::WATParser::TypeParserCtx<wasm::WATParser::ParseDefsCtx>::HeapTypeT,_wasm::Err>
          .
          super__Variant_storage_alias<wasm::WATParser::TypeParserCtx<wasm::WATParser::ParseDefsCtx>::HeapTypeT,_wasm::Err>
          ._32_8_ == &local_90) {
        *puVar2 = CONCAT71(uStack_8f,local_90);
        *(undefined8 *)
         ((long)&(__return_storage_ptr__->val).super__Variant_base<wasm::Ok,_wasm::Err>.
                 super__Move_assign_alias<wasm::Ok,_wasm::Err>.
                 super__Copy_assign_alias<wasm::Ok,_wasm::Err>.
                 super__Move_ctor_alias<wasm::Ok,_wasm::Err>.
                 super__Copy_ctor_alias<wasm::Ok,_wasm::Err>.
                 super__Variant_storage_alias<wasm::Ok,_wasm::Err> + 0x18) = uStack_88;
      }
      else {
        *(undefined8 *)
         &(__return_storage_ptr__->val).super__Variant_base<wasm::Ok,_wasm::Err>.
          super__Move_assign_alias<wasm::Ok,_wasm::Err>.
          super__Copy_assign_alias<wasm::Ok,_wasm::Err>.super__Move_ctor_alias<wasm::Ok,_wasm::Err>.
          super__Copy_ctor_alias<wasm::Ok,_wasm::Err>.
          super__Variant_storage_alias<wasm::Ok,_wasm::Err> =
             type.val.
             super__Variant_base<wasm::WATParser::TypeParserCtx<wasm::WATParser::ParseDefsCtx>::HeapTypeT,_wasm::Err>
             .
             super__Move_assign_alias<wasm::WATParser::TypeParserCtx<wasm::WATParser::ParseDefsCtx>::HeapTypeT,_wasm::Err>
             .
             super__Copy_assign_alias<wasm::WATParser::TypeParserCtx<wasm::WATParser::ParseDefsCtx>::HeapTypeT,_wasm::Err>
             .
             super__Move_ctor_alias<wasm::WATParser::TypeParserCtx<wasm::WATParser::ParseDefsCtx>::HeapTypeT,_wasm::Err>
             .
             super__Copy_ctor_alias<wasm::WATParser::TypeParserCtx<wasm::WATParser::ParseDefsCtx>::HeapTypeT,_wasm::Err>
             .
             super__Variant_storage_alias<wasm::WATParser::TypeParserCtx<wasm::WATParser::ParseDefsCtx>::HeapTypeT,_wasm::Err>
             ._32_8_;
        *(ulong *)((long)&(__return_storage_ptr__->val).super__Variant_base<wasm::Ok,_wasm::Err>.
                          super__Move_assign_alias<wasm::Ok,_wasm::Err>.
                          super__Copy_assign_alias<wasm::Ok,_wasm::Err>.
                          super__Move_ctor_alias<wasm::Ok,_wasm::Err>.
                          super__Copy_ctor_alias<wasm::Ok,_wasm::Err>.
                          super__Variant_storage_alias<wasm::Ok,_wasm::Err> + 0x10) =
             CONCAT71(uStack_8f,local_90);
      }
      *(undefined8 *)
       ((long)&(__return_storage_ptr__->val).super__Variant_base<wasm::Ok,_wasm::Err>.
               super__Move_assign_alias<wasm::Ok,_wasm::Err>.
               super__Copy_assign_alias<wasm::Ok,_wasm::Err>.
               super__Move_ctor_alias<wasm::Ok,_wasm::Err>.
               super__Copy_ctor_alias<wasm::Ok,_wasm::Err>.
               super__Variant_storage_alias<wasm::Ok,_wasm::Err> + 8) = local_98;
      local_90 = 0;
      *(__index_type *)
       ((long)&(__return_storage_ptr__->val).super__Variant_base<wasm::Ok,_wasm::Err>.
               super__Move_assign_alias<wasm::Ok,_wasm::Err>.
               super__Copy_assign_alias<wasm::Ok,_wasm::Err>.
               super__Move_ctor_alias<wasm::Ok,_wasm::Err>.
               super__Copy_ctor_alias<wasm::Ok,_wasm::Err>.
               super__Variant_storage_alias<wasm::Ok,_wasm::Err> + 0x20) = '\x01';
      type.val.
      super__Variant_base<wasm::WATParser::TypeParserCtx<wasm::WATParser::ParseDefsCtx>::HeapTypeT,_wasm::Err>
      .
      super__Move_assign_alias<wasm::WATParser::TypeParserCtx<wasm::WATParser::ParseDefsCtx>::HeapTypeT,_wasm::Err>
      .
      super__Copy_assign_alias<wasm::WATParser::TypeParserCtx<wasm::WATParser::ParseDefsCtx>::HeapTypeT,_wasm::Err>
      .
      super__Move_ctor_alias<wasm::WATParser::TypeParserCtx<wasm::WATParser::ParseDefsCtx>::HeapTypeT,_wasm::Err>
      .
      super__Copy_ctor_alias<wasm::WATParser::TypeParserCtx<wasm::WATParser::ParseDefsCtx>::HeapTypeT,_wasm::Err>
      .
      super__Variant_storage_alias<wasm::WATParser::TypeParserCtx<wasm::WATParser::ParseDefsCtx>::HeapTypeT,_wasm::Err>
      ._32_8_ = &local_90;
      std::__detail::__variant::
      _Variant_storage<false,_std::vector<wasm::WATParser::ParseDefsCtx::OnClauseInfo,_std::allocator<wasm::WATParser::ParseDefsCtx::OnClauseInfo>_>,_wasm::Err>
      ::~_Variant_storage((_Variant_storage<false,_std::vector<wasm::WATParser::ParseDefsCtx::OnClauseInfo,_std::allocator<wasm::WATParser::ParseDefsCtx::OnClauseInfo>_>,_wasm::Err>
                           *)((long)&resumetable.val.
                                     super__Variant_base<std::vector<wasm::WATParser::ParseDefsCtx::OnClauseInfo,_std::allocator<wasm::WATParser::ParseDefsCtx::OnClauseInfo>_>,_wasm::Err>
                                     .
                                     super__Move_assign_alias<std::vector<wasm::WATParser::ParseDefsCtx::OnClauseInfo>,_wasm::Err>
                                     .
                                     super__Copy_assign_alias<std::vector<wasm::WATParser::ParseDefsCtx::OnClauseInfo>,_wasm::Err>
                                     .
                                     super__Move_ctor_alias<std::vector<wasm::WATParser::ParseDefsCtx::OnClauseInfo>,_wasm::Err>
                                     .
                                     super__Copy_ctor_alias<std::vector<wasm::WATParser::ParseDefsCtx::OnClauseInfo>,_wasm::Err>
                             + 0x20));
    }
    else {
      std::__detail::__variant::
      _Variant_storage<false,_std::vector<wasm::WATParser::ParseDefsCtx::OnClauseInfo,_std::allocator<wasm::WATParser::ParseDefsCtx::OnClauseInfo>_>,_wasm::Err>
      ::~_Variant_storage((_Variant_storage<false,_std::vector<wasm::WATParser::ParseDefsCtx::OnClauseInfo,_std::allocator<wasm::WATParser::ParseDefsCtx::OnClauseInfo>_>,_wasm::Err>
                           *)((long)&resumetable.val.
                                     super__Variant_base<std::vector<wasm::WATParser::ParseDefsCtx::OnClauseInfo,_std::allocator<wasm::WATParser::ParseDefsCtx::OnClauseInfo>_>,_wasm::Err>
                                     .
                                     super__Move_assign_alias<std::vector<wasm::WATParser::ParseDefsCtx::OnClauseInfo>,_wasm::Err>
                                     .
                                     super__Copy_assign_alias<std::vector<wasm::WATParser::ParseDefsCtx::OnClauseInfo>,_wasm::Err>
                                     .
                                     super__Move_ctor_alias<std::vector<wasm::WATParser::ParseDefsCtx::OnClauseInfo>,_wasm::Err>
                                     .
                                     super__Copy_ctor_alias<std::vector<wasm::WATParser::ParseDefsCtx::OnClauseInfo>,_wasm::Err>
                             + 0x20));
      resumetable_00 =
           (_Copy_ctor_base<false,_std::vector<wasm::WATParser::ParseDefsCtx::OnClauseInfo,_std::allocator<wasm::WATParser::ParseDefsCtx::OnClauseInfo>_>,_wasm::Err>
            *)0x0;
      if (resumetable.val.
          super__Variant_base<std::vector<wasm::WATParser::ParseDefsCtx::OnClauseInfo,_std::allocator<wasm::WATParser::ParseDefsCtx::OnClauseInfo>_>,_wasm::Err>
          .
          super__Move_assign_alias<std::vector<wasm::WATParser::ParseDefsCtx::OnClauseInfo>,_wasm::Err>
          .
          super__Copy_assign_alias<std::vector<wasm::WATParser::ParseDefsCtx::OnClauseInfo>,_wasm::Err>
          .
          super__Move_ctor_alias<std::vector<wasm::WATParser::ParseDefsCtx::OnClauseInfo>,_wasm::Err>
          .
          super__Copy_ctor_alias<std::vector<wasm::WATParser::ParseDefsCtx::OnClauseInfo>,_wasm::Err>
          .
          super__Variant_storage_alias<std::vector<wasm::WATParser::ParseDefsCtx::OnClauseInfo>,_wasm::Err>
          ._M_u._24_1_ == '\0') {
        resumetable_00 =
             (_Copy_ctor_base<false,_std::vector<wasm::WATParser::ParseDefsCtx::OnClauseInfo,_std::allocator<wasm::WATParser::ParseDefsCtx::OnClauseInfo>_>,_wasm::Err>
              *)local_80;
      }
      ParseDefsCtx::makeResume
                (__return_storage_ptr__,ctx,pos,annotations,(HeapType)local_c8,
                 (vector<wasm::WATParser::ParseDefsCtx::OnClauseInfo,_std::allocator<wasm::WATParser::ParseDefsCtx::OnClauseInfo>_>
                  *)resumetable_00);
    }
    std::__detail::__variant::
    _Variant_storage<false,_std::vector<wasm::WATParser::ParseDefsCtx::OnClauseInfo,_std::allocator<wasm::WATParser::ParseDefsCtx::OnClauseInfo>_>,_wasm::Err>
    ::~_Variant_storage((_Variant_storage<false,_std::vector<wasm::WATParser::ParseDefsCtx::OnClauseInfo,_std::allocator<wasm::WATParser::ParseDefsCtx::OnClauseInfo>_>,_wasm::Err>
                         *)local_80);
  }
  std::__detail::__variant::
  _Variant_storage<false,_wasm::WATParser::TypeParserCtx<wasm::WATParser::ParseDefsCtx>::HeapTypeT,_wasm::Err>
  ::~_Variant_storage((_Variant_storage<false,_wasm::WATParser::TypeParserCtx<wasm::WATParser::ParseDefsCtx>::HeapTypeT,_wasm::Err>
                       *)local_c8);
  return __return_storage_ptr__;
}

Assistant:

Result<>
makeResume(Ctx& ctx, Index pos, const std::vector<Annotation>& annotations) {
  auto type = typeidx(ctx);
  CHECK_ERR(type);

  auto resumetable = makeResumeTable(ctx);
  CHECK_ERR(resumetable);

  return ctx.makeResume(pos, annotations, *type, *resumetable);
}